

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spake2plus.cc
# Opt level: O0

bool __thiscall
bssl::spake2plus::Verifier::ProcessProverShare
          (Verifier *this,Span<unsigned_char> out_share,Span<unsigned_char> out_confirm,
          Span<unsigned_char> out_secret,Span<const_unsigned_char> prover_share)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  EC_GROUP *group_00;
  uchar *puVar4;
  uchar *out_secret_00;
  uchar *prover_share_00;
  uchar *verifier_share;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  undefined1 local_b18 [8];
  EC_AFFINE V;
  EC_JACOBIAN L_j;
  EC_AFFINE Z;
  EC_JACOBIAN tmp;
  EC_JACOBIAN T;
  EC_JACOBIAN X_j;
  EC_AFFINE X;
  EC_JACOBIAN r2;
  size_t written;
  EC_AFFINE Y;
  EC_JACOBIAN Y_j;
  uchar *local_3b8;
  EC_JACOBIAN *local_3b0;
  uchar *local_3a8;
  undefined1 local_3a0 [8];
  EC_JACOBIAN N_j;
  EC_JACOBIAN M_j;
  EC_JACOBIAN r;
  EC_JACOBIAN l;
  EC_GROUP *group;
  Verifier *this_local;
  Span<unsigned_char> out_confirm_local;
  Span<unsigned_char> out_share_local;
  
  puVar4 = (uchar *)out_confirm.size_;
  this_local = (Verifier *)out_confirm.data_;
  out_confirm_local.size_ = (size_t)out_share.data_;
  out_confirm_local.data_ = puVar4;
  if ((((this->state_ != kInit) ||
       (sVar3 = Span<unsigned_char>::size((Span<unsigned_char> *)&out_confirm_local.size_),
       sVar3 != 0x41)) ||
      (sVar3 = Span<unsigned_char>::size((Span<unsigned_char> *)&this_local), sVar3 != 0x20)) ||
     ((sVar3 = Span<unsigned_char>::size(&out_secret), sVar3 != 0x20 ||
      (sVar3 = Span<const_unsigned_char>::size(&prover_share), sVar3 != 0x41)))) {
    ERR_put_error(0xe,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/spake2plus/spake2plus.cc"
                  ,0x19c);
    return false;
  }
  group_00 = EC_group_p256();
  Span<unsigned_char_const>::Span<65ul>
            ((Span<unsigned_char_const> *)&local_3b0,(uchar (*) [65])(anonymous_namespace)::kM_bytes
            );
  in.size_ = (size_t)puVar4;
  in.data_ = local_3a8;
  anon_unknown_0::ConstantToJacobian
            ((anon_unknown_0 *)group_00,(EC_GROUP *)(N_j.Z.words + 8),local_3b0,in);
  Span<unsigned_char_const>::Span<65ul>
            ((Span<unsigned_char_const> *)(Y_j.Z.words + 8),
             (uchar (*) [65])(anonymous_namespace)::kN_bytes);
  in_00.size_ = (size_t)puVar4;
  in_00.data_ = local_3b8;
  anon_unknown_0::ConstantToJacobian
            ((anon_unknown_0 *)group_00,(EC_GROUP *)local_3a0,(EC_JACOBIAN *)Y_j.Z.words[8],in_00);
  iVar2 = ec_point_mul_scalar_base(group_00,(EC_JACOBIAN *)(r.Z.words + 8),&this->y_);
  if ((iVar2 == 0) ||
     (iVar2 = ec_point_mul_scalar(group_00,(EC_JACOBIAN *)(M_j.Z.words + 8),(EC_JACOBIAN *)local_3a0
                                  ,&this->w0_), iVar2 == 0)) {
    ERR_put_error(0xe,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/spake2plus/spake2plus.cc"
                  ,0x1aa);
    return false;
  }
  (*group_00->meth->add)
            (group_00,(EC_JACOBIAN *)(Y.Y.words + 8),(EC_JACOBIAN *)(r.Z.words + 8),
             (EC_JACOBIAN *)(M_j.Z.words + 8));
  iVar2 = ec_jacobian_to_affine(group_00,(EC_AFFINE *)&written,(EC_JACOBIAN *)(Y.Y.words + 8));
  if (iVar2 == 0) {
    ERR_put_error(0xe,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/spake2plus/spake2plus.cc"
                  ,0x1b2);
    return false;
  }
  puVar4 = Span<unsigned_char>::data((Span<unsigned_char> *)&out_confirm_local.size_);
  r2.Z.words[8] =
       ec_point_to_bytes(group_00,(EC_AFFINE *)&written,POINT_CONVERSION_UNCOMPRESSED,puVar4,0x41);
  if (r2.Z.words[8] != 0x41) {
    abort();
  }
  puVar4 = Span<const_unsigned_char>::data(&prover_share);
  sVar3 = Span<const_unsigned_char>::size(&prover_share);
  iVar2 = ec_point_from_uncompressed(group_00,(EC_AFFINE *)(X_j.Z.words + 8),puVar4,sVar3);
  if ((iVar2 == 0) ||
     (iVar2 = ec_point_mul_scalar(group_00,(EC_JACOBIAN *)(X.Y.words + 8),
                                  (EC_JACOBIAN *)(N_j.Z.words + 8),&this->w0_), iVar2 == 0)) {
    ERR_put_error(0xe,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/spake2plus/spake2plus.cc"
                  ,0x1bf);
    return false;
  }
  ec_felem_neg(group_00,(EC_FELEM *)(r2.X.words + 8),(EC_FELEM *)(r2.X.words + 8));
  ec_affine_to_jacobian(group_00,(EC_JACOBIAN *)(T.Z.words + 8),(EC_AFFINE *)(X_j.Z.words + 8));
  (*group_00->meth->add)
            (group_00,(EC_JACOBIAN *)(tmp.Z.words + 8),(EC_JACOBIAN *)(T.Z.words + 8),
             (EC_JACOBIAN *)(X.Y.words + 8));
  iVar2 = ec_point_mul_scalar(group_00,(EC_JACOBIAN *)(Z.Y.words + 8),
                              (EC_JACOBIAN *)(tmp.Z.words + 8),&this->y_);
  if ((iVar2 != 0) &&
     (iVar2 = ec_jacobian_to_affine
                        (group_00,(EC_AFFINE *)(L_j.Z.words + 8),(EC_JACOBIAN *)(Z.Y.words + 8)),
     iVar2 != 0)) {
    ec_affine_to_jacobian(group_00,(EC_JACOBIAN *)(V.Y.words + 8),&this->L_);
    iVar2 = ec_point_mul_scalar(group_00,(EC_JACOBIAN *)(Z.Y.words + 8),
                                (EC_JACOBIAN *)(V.Y.words + 8),&this->y_);
    if ((iVar2 != 0) &&
       (iVar2 = ec_jacobian_to_affine
                          (group_00,(EC_AFFINE *)local_b18,(EC_JACOBIAN *)(Z.Y.words + 8)),
       iVar2 != 0)) {
      puVar4 = Span<unsigned_char>::data((Span<unsigned_char> *)&this_local);
      out_secret_00 = Span<unsigned_char>::data(&out_secret);
      prover_share_00 = Span<const_unsigned_char>::data(&prover_share);
      verifier_share = Span<unsigned_char>::data((Span<unsigned_char> *)&out_confirm_local.size_);
      bVar1 = anon_unknown_0::ComputeTranscript
                        (this->confirm_,puVar4,out_secret_00,prover_share_00,verifier_share,
                         &this->transcript_hash_,(EC_AFFINE *)(L_j.Z.words + 8),
                         (EC_AFFINE *)local_b18,&this->w0_);
      if (!bVar1) {
        ERR_put_error(0xe,0,0x44,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/spake2plus/spake2plus.cc"
                      ,0x1df);
        return false;
      }
      this->state_ = kProverShareSeen;
      return true;
    }
    ERR_put_error(0xe,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/spake2plus/spake2plus.cc"
                  ,0x1d8);
    return false;
  }
  ERR_put_error(0xe,0,0x44,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/spake2plus/spake2plus.cc"
                ,0x1cf);
  return false;
}

Assistant:

bool Verifier::ProcessProverShare(Span<uint8_t> out_share,
                                  Span<uint8_t> out_confirm,
                                  Span<uint8_t> out_secret,
                                  Span<const uint8_t> prover_share) {
  if (state_ != State::kInit ||  //
      out_share.size() != kShareSize || out_confirm.size() != kConfirmSize ||
      out_secret.size() != kSecretSize || prover_share.size() != kShareSize) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  const EC_GROUP *group = EC_group_p256();
  EC_JACOBIAN l, r, M_j, N_j;
  ConstantToJacobian(group, &M_j, kM_bytes);
  ConstantToJacobian(group, &N_j, kN_bytes);

  // Compute Y = y×P + w0×M.
  // TODO(crbug.com/383778231): This could be sped up with a constant-time,
  // two-point multiplication.
  if (!ec_point_mul_scalar_base(group, &l, &y_) ||
      !ec_point_mul_scalar(group, &r, &N_j, &w0_)) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  EC_JACOBIAN Y_j;
  EC_AFFINE Y;
  group->meth->add(group, &Y_j, &l, &r);
  if (!ec_jacobian_to_affine(group, &Y, &Y_j)) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  const size_t written = ec_point_to_bytes(
      group, &Y, POINT_CONVERSION_UNCOMPRESSED, out_share.data(), kShareSize);
  BSSL_CHECK(written == kShareSize);

  EC_JACOBIAN r2;
  EC_AFFINE X;
  if (!ec_point_from_uncompressed(group, &X, prover_share.data(),
                                  prover_share.size()) ||
      !ec_point_mul_scalar(group, &r2, &M_j, &w0_)) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  ec_felem_neg(group, &r2.Y, &r2.Y);

  EC_JACOBIAN X_j, T;
  ec_affine_to_jacobian(group, &X_j, &X);
  group->meth->add(group, &T, &X_j, &r2);

  // TODO(crbug.com/383778231): The two affine conversions could be batched
  // together.
  EC_JACOBIAN tmp;
  EC_AFFINE Z;
  if (!ec_point_mul_scalar(group, &tmp, &T, &y_) ||  //
      !ec_jacobian_to_affine(group, &Z, &tmp)) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  EC_JACOBIAN L_j;
  EC_AFFINE V;
  ec_affine_to_jacobian(group, &L_j, &L_);
  if (!ec_point_mul_scalar(group, &tmp, &L_j, &y_) ||  //
      !ec_jacobian_to_affine(group, &V, &tmp)) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  if (!ComputeTranscript(confirm_, out_confirm.data(), out_secret.data(),
                         prover_share.data(), out_share.data(),
                         &transcript_hash_, &Z, &V, &w0_)) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  state_ = State::kProverShareSeen;
  return true;
}